

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionElement::IfcDistributionElement
          (IfcDistributionElement *this,void **vtt)

{
  void **vtt_local;
  IfcDistributionElement *this_local;
  
  IfcElement::IfcElement(&this->super_IfcElement,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionElement,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionElement,_0UL> *)
             &(this->super_IfcElement).field_0x138,vtt + 0x1f);
  *(void **)&(this->super_IfcElement).super_IfcProduct.super_IfcObject = *vtt;
  *(void **)(&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x0 +
            *(long *)(*(long *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject + -0x18))
       = vtt[0x21];
  *(void **)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x88 = vtt[0x22];
  (this->super_IfcElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x23];
  *(void **)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0xd0 = vtt[0x24];
  *(void **)&(this->super_IfcElement).super_IfcProduct.field_0x100 = vtt[0x25];
  *(void **)&(this->super_IfcElement).field_0x138 = vtt[0x26];
  return;
}

Assistant:

IfcDistributionElement() : Object("IfcDistributionElement") {}